

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isRightAssociative(SyntaxKind kind)

{
  if ((((0x2b < kind - IffPropertyExpr) ||
       ((0xc0000001081U >> ((ulong)(kind - IffPropertyExpr) & 0x3f) & 1) == 0)) &&
      ((0x31 < kind - ThroughoutSequenceExpr ||
       ((0x3000000000001U >> ((ulong)(kind - ThroughoutSequenceExpr) & 0x3f) & 1) == 0)))) &&
     ((1 < kind - SUntilPropertyExpr && (kind != FollowedByPropertyExpr)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isRightAssociative(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::IffPropertyExpr:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            return true;
        default:
            return false;
    }
}